

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mangle.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  uint uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  ostream *poVar7;
  int iVar8;
  bool bVar9;
  shared_ptr<unsigned_char> data;
  memory_mapper mapper;
  file_handle file;
  string local_1db0;
  random_generator<unsigned_long> rand;
  
  if (argc == 2) {
    std::random_device::random_device(&rand.device_);
    uVar2 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::seed(&rand.generator_,(ulong)uVar2);
    rand.distribution_._M_param._M_a = 0;
    rand.distribution_._M_param._M_b = 0xffffffffffffffff;
    std::__cxx11::string::string((string *)&local_1db0,argv[1],(allocator *)&mapper);
    pstore::file::file_handle::file_handle(&file,&local_1db0);
    std::__cxx11::string::~string((string *)&local_1db0);
    pstore::file::file_handle::open(&file,(char *)0x1,1);
    pstore::memory_mapper::memory_mapper(&mapper,&file,true,0,0xb0);
    std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)&data);
    uVar3 = anon_unknown.dwarf_36ed::random_generator<unsigned_long>::get(&rand,0x11);
    while (bVar9 = uVar3 != 0, uVar3 = uVar3 - 1, bVar9) {
      uVar4 = anon_unknown.dwarf_36ed::random_generator<unsigned_long>::get(&rand,0xb0);
      uVar5 = anon_unknown.dwarf_36ed::random_generator<unsigned_long>::get(&rand);
      uVar6 = anon_unknown.dwarf_36ed::random_generator<unsigned_long>::get(&rand);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      data.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar4] =
           (char)uVar6 << 7 | SUB161(auVar1 % ZEXT816(0xff),0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&data.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pstore::memory_mapper::~memory_mapper(&mapper);
    pstore::file::file_handle::~file_handle(&file);
    std::random_device::~random_device(&rand.device_);
    poVar7 = std::operator<<((ostream *)&std::cerr,"Mangle returning ");
    iVar8 = 0;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
    std::operator<<(poVar7,'\n');
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar7 = std::operator<<(poVar7,*argv);
    poVar7 = std::operator<<(poVar7," path-name\n");
    poVar7 = std::operator<<(poVar7," \"Fuzzes\" the header and r0 footer of the given file.\n");
    std::operator<<(poVar7," Warning: The file is modified in-place.\n");
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int main (int argc, char ** argv) {
    int exit_code = EXIT_SUCCESS;

    if (argc != 2) {
        std::cout << "Usage: " << argv[0] << " path-name\n"
                  << " \"Fuzzes\" the header and r0 footer of the given file.\n"
                  << " Warning: The file is modified in-place.\n";
        return EXIT_FAILURE;
    }

    PSTORE_TRY {
        random_generator<std::size_t> rand;

        auto const header_size = pstore::leader_size + sizeof (pstore::trailer);

        pstore::file::file_handle file{argv[1]};
        file.open (pstore::file::file_handle::create_mode::open_existing,
                   pstore::file::file_handle::writable_mode::read_write);
        pstore::memory_mapper mapper (file,
                                      true,         // writable
                                      0,            // offset
                                      header_size); // length
        auto data = std::static_pointer_cast<std::uint8_t> (mapper.data ());
        auto ptr = data.get ();

        std::size_t const num_to_hit = rand.get (header_size / 10);
        for (std::size_t ctr = 0; ctr < num_to_hit; ctr++) {
            std::size_t const offset = rand.get (header_size);
            std::uint8_t new_value = rand.get () % std::numeric_limits<std::uint8_t>::max ();

            // We want the highest bit set more often, in case of signedness issues.
            if (rand.get () % 2) {
                new_value |= 0x80;
            }

            ptr[offset] = new_value;
        }
    }